

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.h
# Opt level: O0

void __thiscall
Assimp::ComputeSpatialSortProcess::Execute(ComputeSpatialSortProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiMesh *pMesh;
  Logger *this_00;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *this_01;
  reference this_02;
  ai_real aVar2;
  _Type *blubb;
  aiMesh *mesh;
  iterator iStack_40;
  uint i;
  iterator it;
  allocator<std::pair<Assimp::SpatialSort,_float>_> local_21;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *local_20;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *p;
  aiScene *pScene_local;
  ComputeSpatialSortProcess *this_local;
  
  p = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
       *)pScene;
  pScene_local = (aiScene *)this;
  this_00 = DefaultLogger::get();
  Logger::debug(this_00,"Generate spatially-sorted vertex cache");
  this_01 = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
             *)operator_new(0x18);
  it._M_current._3_1_ = 1;
  uVar1 = *(uint *)&(p->
                    super__Vector_base<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<std::pair<Assimp::SpatialSort,_float>_>::allocator(&local_21);
  std::
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  ::vector(this_01,(ulong)uVar1,&local_21);
  it._M_current._3_1_ = 0;
  std::allocator<std::pair<Assimp::SpatialSort,_float>_>::~allocator(&local_21);
  local_20 = this_01;
  iStack_40 = std::
              vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
              ::begin(this_01);
  mesh._4_4_ = 0;
  while (mesh._4_4_ <
         *(uint *)&(p->
                   super__Vector_base<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pMesh = *(aiMesh **)
             ((long)&((p[1].
                       super__Vector_base<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first).mPlaneNormal.x +
             (ulong)mesh._4_4_ * 8);
    this_02 = __gnu_cxx::
              __normal_iterator<std::pair<Assimp::SpatialSort,_float>_*,_std::vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>_>
              ::operator*(&stack0xffffffffffffffc0);
    SpatialSort::Fill(&this_02->first,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
    aVar2 = ComputePositionEpsilon(pMesh);
    this_02->second = aVar2;
    mesh._4_4_ = mesh._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<std::pair<Assimp::SpatialSort,_float>_*,_std::vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>_>
    ::operator++(&stack0xffffffffffffffc0);
  }
  SharedPostProcessInfo::
  AddProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
            ((this->super_BaseProcess).shared,"$Spat",local_20);
  return;
}

Assistant:

void Execute( aiScene* pScene)
    {
        typedef std::pair<SpatialSort, ai_real> _Type;
        ASSIMP_LOG_DEBUG("Generate spatially-sorted vertex cache");

        std::vector<_Type>* p = new std::vector<_Type>(pScene->mNumMeshes);
        std::vector<_Type>::iterator it = p->begin();

        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i, ++it) {
            aiMesh* mesh = pScene->mMeshes[i];
            _Type& blubb = *it;
            blubb.first.Fill(mesh->mVertices,mesh->mNumVertices,sizeof(aiVector3D));
            blubb.second = ComputePositionEpsilon(mesh);
        }

        shared->AddProperty(AI_SPP_SPATIAL_SORT,p);
    }